

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O2

void __thiscall Jinx::Variant::SetString(Variant *this,WString *value)

{
  String local_30;
  
  Impl::ConvertWStringToUtf8(&local_30,value);
  SetString(this,&local_30);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&local_30);
  return;
}

Assistant:

inline_t void Variant::SetString(const WString & value)
	{
		SetString(Impl::ConvertWStringToUtf8(value));
	}